

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O0

string * EncodeBase58_abi_cxx11_(Span<const_unsigned_char> input)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  byte *pbVar4;
  reference puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_t in_RDX;
  uchar *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  Span<const_unsigned_char> SVar7;
  int i;
  int carry;
  int size;
  int length;
  int zeroes;
  string *str;
  iterator it;
  reverse_iterator it_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b58;
  Span<const_unsigned_char> *in_stack_fffffffffffffeb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  Span<const_unsigned_char> *in_stack_fffffffffffffec8;
  uint6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 uVar8;
  uchar in_stack_fffffffffffffed7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffee8;
  byte local_109;
  int local_cc;
  uint local_c8;
  int local_b0;
  int local_ac;
  uchar *local_70;
  size_t local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58 [2];
  Span<const_unsigned_char> local_28;
  uchar *local_18;
  size_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_ac = 0;
  local_b0 = 0;
  local_18 = in_RSI;
  local_10 = in_RDX;
  while( true ) {
    sVar2 = Span<const_unsigned_char>::size(in_stack_fffffffffffffeb8);
    bVar6 = false;
    if (sVar2 != 0) {
      puVar3 = Span<const_unsigned_char>::operator[]
                         (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
      bVar6 = *puVar3 == '\0';
    }
    if (!bVar6) break;
    local_28 = Span<const_unsigned_char>::subspan
                         (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    local_18 = local_28.m_data;
    local_10 = local_28.m_size;
    local_ac = local_ac + 1;
  }
  Span<const_unsigned_char>::size(in_stack_fffffffffffffeb8);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffeb8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffee8,(size_type)in_stack_fffffffffffffee0,
             (allocator_type *)in_stack_fffffffffffffed8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffeb8);
  while( true ) {
    sVar2 = Span<const_unsigned_char>::size(in_stack_fffffffffffffeb8);
    if (sVar2 == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffec0);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0);
      while( true ) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffec0);
        bVar6 = __gnu_cxx::
                operator==<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffffec8,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffffec0);
        uVar8 = false;
        if (((bVar6 ^ 0xffU) & 1) != 0) {
          puVar5 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_fffffffffffffeb8);
          uVar8 = *puVar5 == '\0';
        }
        if ((bool)uVar8 == false) break;
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      }
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffed7,(uint7)in_stack_fffffffffffffed0));
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_ac;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffec0);
      __gnu_cxx::operator-
                ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)this,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffec0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffee8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (in_stack_fffffffffffffed8,
                 CONCAT17(in_stack_fffffffffffffed7,CONCAT16(uVar8,in_stack_fffffffffffffed0)),
                 (char)((ulong)this >> 0x38));
      while( true ) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffec0);
        bVar6 = __gnu_cxx::
                operator==<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)this,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_fffffffffffffec0);
        if (((bVar6 ^ 0xffU) & 1) == 0) break;
        in_stack_fffffffffffffec0 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pszBase58;
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)this,(int)((ulong)pszBase58 >> 0x20));
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_fffffffffffffeb8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (this,(char)((ulong)in_stack_fffffffffffffec0 >> 0x38));
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    pbVar4 = Span<const_unsigned_char>::operator[]
                       (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    local_c8 = (uint)*pbVar4;
    local_cc = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rbegin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)));
    while( true ) {
      if ((local_c8 != 0) || (local_109 = 0, local_cc < local_b0)) {
        in_stack_fffffffffffffee8 = local_58;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::rend
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffed7,
                            CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)));
        bVar6 = std::
                operator==<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)in_stack_fffffffffffffec8,
                           (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)in_stack_fffffffffffffec0);
        local_109 = bVar6 ^ 0xff;
      }
      if ((local_109 & 1) == 0) break;
      in_stack_fffffffffffffee0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_fffffffffffffec0);
      iVar1 = local_c8 + (uint)*(byte *)&(in_stack_fffffffffffffee0->_M_dataplus)._M_p * 0x100;
      in_stack_fffffffffffffed7 =
           (char)iVar1 +
           ((char)(uint)((ulong)((long)iVar1 * 0x8d3dcb09) >> 0x25) -
           (char)((long)iVar1 * 0x8d3dcb09 >> 0x3f)) * -0x3a;
      in_stack_fffffffffffffed8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_fffffffffffffec0);
      *(uchar *)&(in_stack_fffffffffffffed8->_M_dataplus)._M_p = in_stack_fffffffffffffed7;
      local_c8 = iVar1 / 0x3a;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffed7,
                               CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
                   (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      local_cc = local_cc + 1;
    }
    if (local_c8 != 0) break;
    local_b0 = local_cc;
    SVar7 = Span<const_unsigned_char>::subspan
                      (in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    local_70 = SVar7.m_data;
    local_18 = local_70;
    local_68 = SVar7.m_size;
    local_10 = local_68;
  }
  __assert_fail("carry == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/base58.cpp"
                ,0x70,"std::string EncodeBase58(Span<const unsigned char>)");
}

Assistant:

std::string EncodeBase58(Span<const unsigned char> input)
{
    // Skip & count leading zeroes.
    int zeroes = 0;
    int length = 0;
    while (input.size() > 0 && input[0] == 0) {
        input = input.subspan(1);
        zeroes++;
    }
    // Allocate enough space in big-endian base58 representation.
    int size = input.size() * 138 / 100 + 1; // log(256) / log(58), rounded up.
    std::vector<unsigned char> b58(size);
    // Process the bytes.
    while (input.size() > 0) {
        int carry = input[0];
        int i = 0;
        // Apply "b58 = b58 * 256 + ch".
        for (std::vector<unsigned char>::reverse_iterator it = b58.rbegin(); (carry != 0 || i < length) && (it != b58.rend()); it++, i++) {
            carry += 256 * (*it);
            *it = carry % 58;
            carry /= 58;
        }

        assert(carry == 0);
        length = i;
        input = input.subspan(1);
    }
    // Skip leading zeroes in base58 result.
    std::vector<unsigned char>::iterator it = b58.begin() + (size - length);
    while (it != b58.end() && *it == 0)
        it++;
    // Translate the result into a string.
    std::string str;
    str.reserve(zeroes + (b58.end() - it));
    str.assign(zeroes, '1');
    while (it != b58.end())
        str += pszBase58[*(it++)];
    return str;
}